

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O2

void __thiscall
wasm::PrintExpressionContents::visitAtomicWait(PrintExpressionContents *this,AtomicWait *curr)

{
  ulong uVar1;
  char *pcVar2;
  ulong uVar3;
  ostream *poVar4;
  Module *in_R8;
  Name name;
  
  prepareColor(this->o);
  uVar1 = (curr->expectedType).id;
  uVar3 = 2;
  if (2 < uVar1) {
    uVar3 = uVar1;
  }
  if ((uVar3 & 0xfffffffffffffffe) != 2) {
    __assert_fail("type == Type::i32 || type == Type::i64",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/Print.cpp"
                  ,0x2d8,"void wasm::PrintExpressionContents::visitAtomicWait(AtomicWait *)");
  }
  poVar4 = std::operator<<(this->o,"memory.atomic.wait");
  pcVar2 = "HEAPF64";
  if (uVar1 < 3) {
    pcVar2 = "HEAPF32";
  }
  std::operator<<(poVar4,pcVar2 + 5);
  Colors::normal(this->o);
  name.super_IString.str._M_str = (char *)this->o;
  name.super_IString.str._M_len = (size_t)(curr->memory).super_IString.str._M_str;
  anon_unknown_0::printMemoryName
            ((anon_unknown_0 *)(curr->memory).super_IString.str._M_len,name,(ostream *)this->wasm,
             in_R8);
  if ((curr->offset).addr != 0) {
    poVar4 = std::operator<<(this->o," offset=");
    std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    return;
  }
  return;
}

Assistant:

void visitAtomicWait(AtomicWait* curr) {
    prepareColor(o);
    Type type = forceConcrete(curr->expectedType);
    assert(type == Type::i32 || type == Type::i64);
    o << "memory.atomic.wait" << (type == Type::i32 ? "32" : "64");
    restoreNormalColor(o);
    printMemoryName(curr->memory, o, wasm);
    if (curr->offset) {
      o << " offset=" << curr->offset;
    }
  }